

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::PythonGenerator::GetDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  pointer pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  BVar1 = (field->value).type.base_type;
  if ((0xb < BVar1 - BASE_TYPE_UTYPE) || (field->presence != kOptional)) {
    if (BVar1 == BASE_TYPE_BOOL) {
      iVar3 = std::__cxx11::string::compare((char *)&(field->value).constant);
      pcVar5 = "True";
      if (iVar3 == 0) {
        pcVar5 = "False";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = pcVar5 + (ulong)(iVar3 == 0) + 4;
      goto LAB_0029322d;
    }
    if (BVar1 - BASE_TYPE_FLOAT < 2) {
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (__return_storage_ptr__,&(this->float_const_gen_).super_FloatConstantGenerator,field
                );
      return __return_storage_ptr__;
    }
    if (BVar1 - BASE_TYPE_UTYPE < 10) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (field->value).constant._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,
                 pcVar2 + (field->value).constant._M_string_length);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = "None";
  pcVar4 = "";
LAB_0029322d:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string GetDefaultValue(const FieldDef &field) const {
    BaseType base_type = field.value.type.base_type;
    if (field.IsScalarOptional()) {
      return "None";
    } else if (IsBool(base_type)) {
      return field.value.constant == "0" ? "False" : "True";
    } else if (IsFloat(base_type)) {
      return float_const_gen_.GenFloatConstant(field);
    } else if (IsInteger(base_type)) {
      return field.value.constant;
    } else {
      // For string, struct, and table.
      return "None";
    }
  }